

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O0

int handle_pp_identifier(Context_conflict1 *ctx)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  long lVar4;
  Define *pDVar5;
  char *fname_00;
  IncludeState *pIVar6;
  uint srclen;
  Define *def_00;
  size_t sStack_50;
  undefined1 local_48 [8];
  size_t deflen;
  Define *def;
  char *sym;
  char *pcStack_28;
  uint line;
  char *fname;
  IncludeState *state;
  Context_conflict1 *ctx_local;
  
  iVar1 = ctx->recursion_count;
  ctx->recursion_count = iVar1 + 1;
  state = (IncludeState *)ctx;
  if (iVar1 < 0x100) {
    fname = (char *)ctx->include_stack;
    pcStack_28 = ((IncludeState *)fname)->filename;
    sym._4_4_ = ((IncludeState *)fname)->line;
    lVar4 = -((ulong)(((IncludeState *)fname)->tokenlen + 1) + 0xf & 0xfffffffffffffff0);
    pcVar3 = ((IncludeState *)fname)->token;
    uVar2 = ((IncludeState *)fname)->tokenlen;
    def = (Define *)(local_48 + lVar4);
    *(undefined8 *)((long)&sStack_50 + lVar4) = 0x150782;
    memcpy((Define *)(local_48 + lVar4),pcVar3,(ulong)uVar2);
    pIVar6 = state;
    pDVar5 = def;
    *(undefined1 *)((long)&def->identifier + (ulong)*(uint *)(fname + 0x20)) = 0;
    *(undefined8 *)((long)&sStack_50 + lVar4) = 0x15079e;
    def_00 = find_define((Context_conflict1 *)pIVar6,(char *)pDVar5);
    pIVar6 = state;
    pDVar5 = def;
    if (def_00 == (Define *)0x0) {
      ctx_local._4_4_ = 0;
    }
    else {
      deflen = (size_t)def_00;
      if (def_00->paramcount == 0) {
        pcVar3 = def_00->definition;
        *(undefined8 *)((long)&sStack_50 + lVar4) = 0x1507e1;
        local_48 = (undefined1  [8])strlen(pcVar3);
        pIVar6 = state;
        fname_00 = pcStack_28;
        uVar2 = sym._4_4_;
        pcVar3 = *(char **)(deflen + 8);
        srclen = SUB84(local_48,0);
        *(undefined8 *)((long)&sStack_50 + lVar4) = 0x150809;
        ctx_local._4_4_ =
             push_source((Context_conflict1 *)pIVar6,fname_00,pcVar3,srclen,uVar2,
                         (MOJOSHADER_includeClose)0x0);
      }
      else {
        *(undefined8 *)((long)&sStack_50 + lVar4) = 0x1507cd;
        ctx_local._4_4_ = handle_macro_args((Context_conflict1 *)pIVar6,(char *)pDVar5,def_00);
      }
    }
  }
  else {
    sStack_50 = 0x150718;
    fail(ctx,"Recursing macros");
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

static int handle_pp_identifier(Context *ctx)
{
    if (ctx->recursion_count++ >= 256)  // !!! FIXME: gcc can figure this out.
    {
        fail(ctx, "Recursing macros");
        return 0;
    } // if

    IncludeState *state = ctx->include_stack;
    const char *fname = state->filename;
    const unsigned int line = state->line;
    char *sym = (char *) alloca(state->tokenlen+1);
    memcpy(sym, state->token, state->tokenlen);
    sym[state->tokenlen] = '\0';

    // Is this identifier #defined?
    const Define *def = find_define(ctx, sym);
    if (def == NULL)
        return 0;   // just send the token through unchanged.
    else if (def->paramcount != 0)
        return handle_macro_args(ctx, sym, def);

    const size_t deflen = strlen(def->definition);
    return push_source(ctx, fname, def->definition, deflen, line, NULL);
}